

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localintermediate.h
# Opt level: O0

void __thiscall
glslang::TIntermediate::TIntermediate(TIntermediate *this,EShLanguage l,int v,EProfile p)

{
  vector<glslang::TRange,_std::allocator<glslang::TRange>_> *local_208;
  vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_> *local_1d0;
  value_type_conflict local_1c8;
  allocator<char> local_1c2;
  allocator<char> local_1c1;
  TBuiltInResource local_1c0;
  EProfile local_1c;
  int local_18;
  EProfile p_local;
  int v_local;
  EShLanguage l_local;
  TIntermediate *this_local;
  
  this->language = l;
  local_1c = p;
  local_18 = v;
  p_local = l;
  _v_local = this;
  std::__cxx11::string::string((string *)&this->entryPointName);
  std::__cxx11::string::string((string *)&this->entryPointMangledName);
  std::__cxx11::list<glslang::TCall,_std::allocator<glslang::TCall>_>::list(&this->callGraph);
  this->profile = local_1c;
  this->version = local_18;
  SpvVersion::SpvVersion(&this->spvVersion);
  this->treeRoot = (TIntermNode *)0x0;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->requestedExtensions);
  memset(&local_1c0,0,0x1a4);
  MustBeAssigned<TBuiltInResource>::MustBeAssigned(&this->resources,&local_1c0);
  this->numEntryPoints = 0;
  this->numErrors = 0;
  this->numPushConstants = 0;
  this->recursive = false;
  this->invertY = false;
  this->dxPositionW = false;
  this->enhancedMsgs = false;
  this->debugInfo = false;
  this->useStorageBuffer = false;
  this->invariantAll = false;
  this->nanMinMaxClamp = false;
  this->depthReplacing = false;
  this->stencilReplacing = false;
  this->uniqueId = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->globalUniformBlockName,"",&local_1c1);
  std::allocator<char>::~allocator(&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->atomicCounterBlockName,"",&local_1c2);
  std::allocator<char>::~allocator(&local_1c2);
  this->globalUniformBlockSet = 0x3f;
  this->globalUniformBlockBinding = 0xffff;
  this->atomicCounterBlockSet = 0x3f;
  this->implicitThisName = "@this";
  this->implicitCounterName = "@count";
  this->source = EShSourceNone;
  this->useVulkanMemoryModel = false;
  this->invocations = -1;
  this->vertices = -1;
  this->inputPrimitive = ElgNone;
  this->outputPrimitive = ElgNone;
  this->pixelCenterInteger = false;
  this->originUpperLeft = false;
  this->texCoordBuiltinRedeclared = false;
  this->vertexSpacing = EvsNone;
  this->vertexOrder = EvoNone;
  this->interlockOrdering = EioNone;
  this->pointMode = false;
  this->earlyFragmentTests = false;
  this->postDepthCoverage = false;
  this->earlyAndLateFragmentTestsAMD = false;
  this->nonCoherentColorAttachmentReadEXT = false;
  this->nonCoherentDepthAttachmentReadEXT = false;
  this->nonCoherentStencilAttachmentReadEXT = false;
  this->depthLayout = EldNone;
  this->stencilLayout = ElsNone;
  this->hlslFunctionality1 = false;
  this->blendEquations = 0;
  this->xfbMode = false;
  std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::vector(&this->xfbBuffers);
  this->multiStream = false;
  this->layoutOverrideCoverage = false;
  this->geoPassthroughEXT = false;
  this->numShaderRecordBlocks = 0;
  this->computeDerivativeMode = LayoutDerivativeNone;
  this->primitives = -1;
  this->numTaskNVBlocks = 0;
  this->layoutPrimitiveCulling = false;
  this->numTaskEXTPayloads = 0;
  std::array<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_6UL>::
  array(&this->shiftBindingForSet);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->resourceSetBinding);
  this->autoMapBindings = false;
  this->autoMapLocations = false;
  this->flattenUniformArrays = false;
  this->useUnknownFormat = false;
  this->hlslOffsets = false;
  this->hlslIoMapping = false;
  this->useVariablePointers = false;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ::set(&this->semanticNameSet);
  this->textureSamplerTransformMode = EShTexSampTransKeep;
  this->needToLegalize = false;
  this->binaryDoubleOutput = false;
  this->subgroupUniformControlFlow = false;
  this->maximallyReconverges = false;
  this->usePhysicalStorageBuffer = false;
  this->useReplicatedComposites = false;
  this->spirvRequirement = (TSpirvRequirement *)0x0;
  this->spirvExecutionMode = (TSpirvExecutionMode *)0x0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>_>_>
  ::map(&this->bindlessTextureModeCaller);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::AstRefType>_>_>
  ::map(&this->bindlessImageModeCaller);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::unordered_map(&this->uniformLocationOverrides);
  this->uniformLocationBase = 0;
  this->quadDerivMode = false;
  this->reqFullQuadsMode = false;
  TNumericFeatures::TNumericFeatures(&this->numericFeatures);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TBlockStorageClass,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TBlockStorageClass>_>_>
  ::unordered_map(&this->blockBackingOverrides);
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
            (&this->usedConstantId);
  std::vector<glslang::TOffsetRange,_std::allocator<glslang::TOffsetRange>_>::vector
            (&this->usedAtomics);
  local_1d0 = this->usedIo;
  do {
    std::vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_>::vector(local_1d0);
    local_1d0 = local_1d0 + 1;
  } while (local_1d0 !=
           (vector<glslang::TIoRange,_std::allocator<glslang::TIoRange>_> *)this->usedIoRT);
  local_208 = this->usedIoRT;
  do {
    std::vector<glslang::TRange,_std::allocator<glslang::TRange>_>::vector(local_208);
    local_208 = local_208 + 1;
  } while ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            *)local_208 != &this->ioAccessed);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ::set(&this->ioAccessed);
  std::__cxx11::string::string((string *)&this->sourceFile);
  std::__cxx11::string::string((string *)&this->sourceText);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->includeText);
  TProcesses::TProcesses(&this->processes);
  this->localSize[0] = 1;
  this->localSize[1] = 1;
  this->localSize[2] = 1;
  this->localSizeNotDefault[0] = false;
  this->localSizeNotDefault[1] = false;
  this->localSizeNotDefault[2] = false;
  this->localSizeSpecId[0] = -1;
  this->localSizeSpecId[1] = -1;
  this->localSizeSpecId[2] = -1;
  std::vector<glslang::TXfbBuffer,_std::allocator<glslang::TXfbBuffer>_>::resize
            (&this->xfbBuffers,0xf);
  local_1c8 = 0;
  std::array<unsigned_int,_6UL>::fill(&this->shiftBinding,&local_1c8);
  return;
}

Assistant:

explicit TIntermediate(EShLanguage l, int v = 0, EProfile p = ENoProfile) :
        language(l),
        profile(p), version(v),
        treeRoot(nullptr),
        resources(TBuiltInResource{}),
        numEntryPoints(0), numErrors(0), numPushConstants(0), recursive(false),
        invertY(false),
        dxPositionW(false),
        enhancedMsgs(false),
        debugInfo(false),
        useStorageBuffer(false),
        invariantAll(false),
        nanMinMaxClamp(false),
        depthReplacing(false),
        stencilReplacing(false),
        uniqueId(0),
        globalUniformBlockName(""),
        atomicCounterBlockName(""),
        globalUniformBlockSet(TQualifier::layoutSetEnd),
        globalUniformBlockBinding(TQualifier::layoutBindingEnd),
        atomicCounterBlockSet(TQualifier::layoutSetEnd),
        implicitThisName("@this"), implicitCounterName("@count"),
        source(EShSourceNone),
        useVulkanMemoryModel(false),
        invocations(TQualifier::layoutNotSet), vertices(TQualifier::layoutNotSet),
        inputPrimitive(ElgNone), outputPrimitive(ElgNone),
        pixelCenterInteger(false), originUpperLeft(false),texCoordBuiltinRedeclared(false),
        vertexSpacing(EvsNone), vertexOrder(EvoNone), interlockOrdering(EioNone), pointMode(false), earlyFragmentTests(false),
        postDepthCoverage(false), earlyAndLateFragmentTestsAMD(false),
        nonCoherentColorAttachmentReadEXT(false),
        nonCoherentDepthAttachmentReadEXT(false),
        nonCoherentStencilAttachmentReadEXT(false),
        depthLayout(EldNone),
        stencilLayout(ElsNone),
        hlslFunctionality1(false),
        blendEquations(0), xfbMode(false), multiStream(false),
        layoutOverrideCoverage(false),
        geoPassthroughEXT(false),
        numShaderRecordBlocks(0),
        computeDerivativeMode(LayoutDerivativeNone),
        primitives(TQualifier::layoutNotSet),
        numTaskNVBlocks(0),
        layoutPrimitiveCulling(false),
        numTaskEXTPayloads(0),
        autoMapBindings(false),
        autoMapLocations(false),
        flattenUniformArrays(false),
        useUnknownFormat(false),
        hlslOffsets(false),
        hlslIoMapping(false),
        useVariablePointers(false),
        textureSamplerTransformMode(EShTexSampTransKeep),
        needToLegalize(false),
        binaryDoubleOutput(false),
        subgroupUniformControlFlow(false),
        maximallyReconverges(false),
        usePhysicalStorageBuffer(false),
        spirvRequirement(nullptr),
        spirvExecutionMode(nullptr),
        uniformLocationBase(0),
        quadDerivMode(false), reqFullQuadsMode(false)
    {
        localSize[0] = 1;
        localSize[1] = 1;
        localSize[2] = 1;
        localSizeNotDefault[0] = false;
        localSizeNotDefault[1] = false;
        localSizeNotDefault[2] = false;
        localSizeSpecId[0] = TQualifier::layoutNotSet;
        localSizeSpecId[1] = TQualifier::layoutNotSet;
        localSizeSpecId[2] = TQualifier::layoutNotSet;
        xfbBuffers.resize(TQualifier::layoutXfbBufferEnd);
        shiftBinding.fill(0);
    }